

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86SHL(uchar *stream,x86Reg reg,int num)

{
  int iVar1;
  byte *pbVar2;
  uchar *start;
  
  if (8 < (int)reg) {
    *stream = 'A';
  }
  if ((char)(byte)num != num) {
    __assert_fail("(char)(num) == num",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x61d,"int x86SHL(unsigned char *, x86Reg, int)");
  }
  pbVar2 = stream + (8 < (int)reg);
  *pbVar2 = (num == 1) << 4 | 0xc1;
  pbVar2[1] = regCode[reg] | 0xe0;
  if (num == 1) {
    iVar1 = (int)pbVar2 + 2;
  }
  else {
    pbVar2[2] = (byte)num;
    iVar1 = (int)pbVar2 + 3;
  }
  return iVar1 - (int)stream;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}